

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CountdownArg
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  PClassActor *cls;
  FState *newstate;
  AActor *mo;
  char *pcVar5;
  DAngle angle;
  FName local_38;
  FName local_34;
  undefined8 local_30;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003e5ab6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e5aa6:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e5ab6:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe75,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  mo = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (mo == (AActor *)0x0) goto LAB_003e59b5;
    bVar4 = DObject::IsKindOf((DObject *)mo,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e5ab6;
    }
  }
  else {
    if (mo != (AActor *)0x0) goto LAB_003e5aa6;
LAB_003e59b5:
    mo = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      uVar2 = param[1].field_0.i;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003e59f5;
        pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003e59f5:
          iVar3 = param[2].field_0.i;
          cls = (PClassActor *)DObject::GetClass((DObject *)mo);
          newstate = FStateLabelStorage::GetState(&StateLabels,iVar3,cls,false);
          if (uVar2 < 5) {
            piVar1 = mo->args + uVar2;
            iVar3 = *piVar1;
            *piVar1 = *piVar1 + -1;
            if (iVar3 == 0) {
              uVar2 = (mo->flags).Value;
              if ((uVar2 >> 0x10 & 1) == 0) {
                if ((uVar2 & 4) == 0) {
                  if (newstate == (FState *)0x0) {
                    local_38.Index = 0x8c;
                    newstate = AActor::FindState(mo,&local_38);
                  }
                  AActor::SetState(mo,newstate,false);
                }
                else {
                  local_34.Index = 0;
                  local_30 = 0;
                  P_DamageMobj(mo,(AActor *)0x0,(AActor *)0x0,mo->health,&local_34,8,angle);
                }
              }
              else {
                P_ExplodeMissile(mo,(line_t_conflict *)0x0,(AActor *)0x0);
              }
            }
          }
          return 0;
        }
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe77,
                    "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe76,
                "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CountdownArg)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(cnt);
	PARAM_STATE_DEF(state)

	if (cnt<0 || cnt >= 5) return 0;
	if (!self->args[cnt]--)
	{
		if (self->flags&MF_MISSILE)
		{
			P_ExplodeMissile(self, NULL, NULL);
		}
		else if (self->flags&MF_SHOOTABLE)
		{
			P_DamageMobj(self, NULL, NULL, self->health, NAME_None, DMG_FORCED);
		}
		else
		{
			if (state == nullptr) state = self->FindState(NAME_Death);
			self->SetState(state);
		}
	}
	return 0;
}